

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid_test.c
# Opt level: O0

bool_t oidTest(void)

{
  int iVar1;
  bool_t bVar2;
  size_t sVar3;
  octet *poVar4;
  char *pcVar5;
  char *pcVar6;
  size_t count;
  char str1 [2048];
  char str [2048];
  octet buf [1024];
  char *in_stack_ffffffffffffebd8;
  octet *in_stack_ffffffffffffebe0;
  octet *der;
  char *in_stack_ffffffffffffebe8;
  octet *in_stack_ffffffffffffebf0;
  char *in_stack_ffffffffffffebf8;
  
  hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                     (size_t)in_stack_ffffffffffffebe8);
  if (sVar3 == 0xffffffffffffffff) {
    hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
    sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                       (size_t)in_stack_ffffffffffffebe8);
    if (sVar3 == 0xffffffffffffffff) {
      hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
      sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                         (size_t)in_stack_ffffffffffffebe8);
      if (sVar3 == 0xffffffffffffffff) {
        hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
        sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                           (size_t)in_stack_ffffffffffffebe8);
        if (sVar3 == 0xffffffffffffffff) {
          hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
          sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                             (size_t)in_stack_ffffffffffffebe8);
          if (sVar3 == 0xffffffffffffffff) {
            hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
            sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                               (size_t)in_stack_ffffffffffffebe8);
            if (sVar3 == 0xffffffffffffffff) {
              hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
              sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                                 (size_t)in_stack_ffffffffffffebe8);
              if (sVar3 == 0xffffffffffffffff) {
                hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                                   (size_t)in_stack_ffffffffffffebe8);
                if ((sVar3 != 0xffffffffffffffff) &&
                   (iVar1 = strCmp((char *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8),
                   iVar1 == 0)) {
                  hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                                     (size_t)in_stack_ffffffffffffebe8);
                  if ((sVar3 == 0xffffffffffffffff) ||
                     (iVar1 = strCmp((char *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8),
                     iVar1 != 0)) {
                    return 0;
                  }
                  hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  sVar3 = oidFromDER(in_stack_ffffffffffffebf8,in_stack_ffffffffffffebf0,
                                     (size_t)in_stack_ffffffffffffebe8);
                  if ((sVar3 == 0xffffffffffffffff) ||
                     (iVar1 = strCmp((char *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8),
                     iVar1 != 0)) {
                    return 0;
                  }
                  poVar4 = (octet *)oidToDER(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  if (((poVar4 == (octet *)0xffffffffffffffff) ||
                      (sVar3 = oidFromDER(in_stack_ffffffffffffebf8,poVar4,
                                          (size_t)in_stack_ffffffffffffebe8),
                      sVar3 == 0xffffffffffffffff)) ||
                     (iVar1 = strCmp((char *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8),
                     iVar1 != 0)) {
                    return 0;
                  }
                  hexTo(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  sVar3 = oidFromDER(in_stack_ffffffffffffebf8,poVar4,
                                     (size_t)in_stack_ffffffffffffebe8);
                  if (sVar3 != 0xffffffffffffffff) {
                    return 0;
                  }
                  bVar2 = oidIsValid(in_stack_ffffffffffffebe8);
                  if (bVar2 != 0) {
                    return 0;
                  }
                  poVar4 = (octet *)oidToDER(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                  if ((poVar4 != (octet *)0xb) ||
                     (bVar2 = hexEq((void *)0xb,in_stack_ffffffffffffebe8), bVar2 == 0)) {
                    return 0;
                  }
                  sVar3 = oidFromDER(in_stack_ffffffffffffebf8,poVar4,
                                     (size_t)in_stack_ffffffffffffebe8);
                  if (sVar3 != 0xffffffffffffffff) {
                    return 0;
                  }
                  sVar3 = oidFromDER(in_stack_ffffffffffffebf8,poVar4,
                                     (size_t)in_stack_ffffffffffffebe8);
                  if (sVar3 == 0xffffffffffffffff) {
                    strCopy((char *)poVar4,in_stack_ffffffffffffebe8);
                    poVar4 = (octet *)oidToDER(in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
                    if (poVar4 != (octet *)0xffffffffffffffff) {
                      pcVar5 = (char *)oidFromDER(in_stack_ffffffffffffebf8,poVar4,
                                                  (size_t)in_stack_ffffffffffffebe8);
                      pcVar6 = (char *)strLen((char *)0x105cf0);
                      if ((pcVar5 == pcVar6) &&
                         (iVar1 = strCmp((char *)in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8
                                        ), iVar1 == 0)) {
                        sVar3 = strLen((char *)0x105d2e);
                        (&stack0xffffffffffffebf8)[sVar3] = 0x2e;
                        der = &stack0xffffffffffffebf8;
                        strLen((char *)0x105d4a);
                        strCopy((char *)poVar4,pcVar5);
                        poVar4 = (octet *)oidToDER(der,in_stack_ffffffffffffebd8);
                        if (poVar4 != (octet *)0xffffffffffffffff) {
                          pcVar5 = (char *)oidFromDER(in_stack_ffffffffffffebf8,poVar4,
                                                      (size_t)pcVar5);
                          pcVar6 = (char *)strLen((char *)0x105daa);
                          if ((pcVar5 == pcVar6) && (iVar1 = strCmp((char *)der,pcVar5), iVar1 == 0)
                             ) {
                            return 1;
                          }
                        }
                        return 0;
                      }
                    }
                    return 0;
                  }
                  return 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

bool_t oidTest()
{
	octet buf[1024];
	char str[2048];
	char str1[2048];
	size_t count;
	// length octet 0x00
	hexTo(buf, "060000");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// length octet 0x80
	hexTo(buf, "068000");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// length octet 0xFF
	hexTo(buf, "06FF00");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// invalid type
	hexTo(buf, "080100");
	if (oidFromDER(0, buf, 3) != SIZE_MAX)
		return FALSE;
	// illegal padding
	hexTo(buf, "06070180808080807F");
	if (oidFromDER(0, buf, 9) != SIZE_MAX)
		return FALSE;
	hexTo(buf, "06028001");
	if (oidFromDER(0, buf, 4) != SIZE_MAX)
		return FALSE;
	hexTo(buf, "0602807F");
	if (oidFromDER(0, buf, 4) != SIZE_MAX)
		return FALSE;
	// MacOS errors
	hexTo(buf, "06028100");
	if (oidFromDER(str, buf, 4) == SIZE_MAX || !strEq(str, "2.48"))
		return FALSE;
	hexTo(buf, "06028101");
	if (oidFromDER(str, buf, 4) == SIZE_MAX || !strEq(str, "2.49"))
		return FALSE;
	hexTo(buf, "06028837");
	if (oidFromDER(str, buf, 4) == SIZE_MAX || !strEq(str, "2.999"))
		return FALSE;
	// OpenSSL errors
	count = oidToDER(buf, "2.65500");
	if (count == SIZE_MAX || oidFromDER(str, buf, count) == SIZE_MAX ||
		!strEq(str, "2.65500"))
		return FALSE;
	// overflow
	hexTo(buf, "060981B1D1AF85ECA8804F");
	if (oidFromDER(0, buf, 11) != SIZE_MAX)
		return FALSE;
	if (oidIsValid("2.5.4.4294967299"))
		return FALSE;
	// belt-hash
	count = oidToDER(buf, "1.2.112.0.2.0.34.101.31.81");
	if (count != 11 || !hexEq(buf, "06092A7000020022651F51"))
		return FALSE;
	if (oidFromDER(str, buf, count - 1) != SIZE_MAX)
		return FALSE;
	if (oidFromDER(0, buf, count + 1) != SIZE_MAX)
		return FALSE;
	// длинная длина
	strCopy(str1, "1.2.3456.78910.11121314.15161718.19202122.23242526."
		"27282930.31323334.35363738.1.2.3.4.5.6.7.8.9.10.11.12.13.14.15.16.17.18."
		"19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42."
		"43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66."
		"19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42."
		"43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66."
		"19.20.21.22.23.24.25.26.27.28.29.30.31.32.33.34.35.36.37.38.39.40.41.42."
		"43.44.45.46.47.48.49.50.51.52.53.54.55.56.57.58.59.60.61.62.63.64.65.66");
	count = oidToDER(buf, str1);
	if (count == SIZE_MAX ||
		oidFromDER(str, buf, count) != strLen(str1) ||
		!strEq(str, str1))
		return FALSE;
	str1[strLen(str1)] = '.';
	strCopy(str1 + strLen(str) + 1, str);
	count = oidToDER(buf, str1);
	if (count == SIZE_MAX ||
		oidFromDER(str, buf, count) != strLen(str1) ||
		!strEq(str, str1))
		return FALSE;
	// все нормально
	return TRUE;
}